

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O2

void __thiscall
WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
::WorkerLoop(WorkerQueue<QueryDatabaseSearcherWorker<Protein>,_std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<Protein>_*,_const_SearchParams<Protein>_&>
             *this,WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   **args,Database<Protein> **args_1,SearchParams<Protein> *args_2)

{
  function<void_(unsigned_long,_unsigned_long)> *pfVar1;
  size_type sVar2;
  _Map_pointer *this_00;
  function<void_(unsigned_long,_unsigned_long)> *cb;
  function<void_(unsigned_long,_unsigned_long)> *this_01;
  function<void_(unsigned_long,_unsigned_long)> *pfVar3;
  undefined1 local_180 [8];
  QueryDatabaseSearcherWorker<Protein> worker;
  deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> queueItem;
  unique_lock<std::mutex> lock;
  long local_38;
  
  std::_Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::_Deque_base
            ((_Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)&worker.mWriter)
  ;
  worker.mGlobalSearch.mBandedAlign.mParams._16_8_ = *args;
  worker.mGlobalSearch.super_Search<Protein>._vptr_Search = (_func_int **)*args_1;
  local_180 = (undefined1  [8])&PTR_SearchForHits_001c2108;
  worker.mGlobalSearch.super_Search<Protein>.mParams = (SearchParams<Protein> *)0x0;
  worker.mGlobalSearch.mHits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  worker.mGlobalSearch.mHits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  worker.mGlobalSearch.mHits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x20;
  worker.mGlobalSearch.mHits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffec;
  worker.mGlobalSearch.mExtendAlign.mAP.xDrop = -2;
  worker.mGlobalSearch.mExtendAlign.mAP.gapExtendScore = 0;
  worker.mGlobalSearch.mExtendAlign._12_4_ = 0;
  worker.mGlobalSearch.mExtendAlign.mRow.
  super__Vector_base<ExtendAlign<Protein>::Cell,_std::allocator<ExtendAlign<Protein>::Cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mRow.
  super__Vector_base<ExtendAlign<Protein>::Cell,_std::allocator<ExtendAlign<Protein>::Cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mRow.
  super__Vector_base<ExtendAlign<Protein>::Cell,_std::allocator<ExtendAlign<Protein>::Cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  worker.mGlobalSearch.mExtendAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mVerticalGaps.
  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mVerticalGaps.
  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mVerticalGaps.
  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  worker.mGlobalSearch.mBandedAlign.mOperations.
  super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x10;
  worker.mGlobalSearch.mBandedAlign.mParams.bandwidth = 0xfffffffeffffffec;
  worker.mGlobalSearch.mBandedAlign.mParams.interiorGapOpenScore = -2;
  worker.mGlobalSearch.mBandedAlign.mParams.interiorGapExtendScore = -1;
  worker.mGlobalSearch.super_Search<Protein>.mDB = (Database<Protein> *)args_2;
  while( true ) {
    this_00 = &queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)this_00,(mutex_type *)(this + 0x80));
    while ((((byte)this[0xa8] & 1) == 0 && (*(long *)(this + 0xe0) == *(long *)(this + 0xc0)))) {
      std::condition_variable::wait((unique_lock *)(this + 0x50));
    }
    if (((byte)this[0xa8] & 1) != 0) break;
    std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::_M_move_assign1
              ((deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)&worker.mWriter,
               *(undefined8 *)(this + 0xc0));
    std::
    deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>
    ::pop_front((deque<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>,_std::allocator<std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>_>_>
                 *)(this + 0xb0));
    LOCK();
    *(int *)(this + 0xac) = *(int *)(this + 0xac) + 1;
    UNLOCK();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_00);
    QueryDatabaseSearcherWorker<Protein>::Process
              ((QueryDatabaseSearcherWorker<Protein> *)local_180,
               (SequenceList<Protein> *)&worker.mWriter);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)this_00,(mutex_type *)(this + 0x80));
    sVar2 = std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::size
                      ((deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)
                       &worker.mWriter);
    *(size_type *)(this + 0x108) = *(long *)(this + 0x108) + sVar2;
    LOCK();
    *(int *)(this + 0xac) = *(int *)(this + 0xac) + -1;
    UNLOCK();
    this_01 = *(function<void_(unsigned_long,_unsigned_long)> **)(this + 0x120);
    pfVar3 = *(function<void_(unsigned_long,_unsigned_long)> **)(this + 0x130);
    local_38 = *(long *)(this + 0x138);
    pfVar1 = *(function<void_(unsigned_long,_unsigned_long)> **)(this + 0x140);
    while (this_01 != pfVar1) {
      std::function<void_(unsigned_long,_unsigned_long)>::operator()
                (this_01,*(unsigned_long *)(this + 0x108),*(unsigned_long *)(this + 0x100));
      this_01 = this_01 + 1;
      if (this_01 == pfVar3) {
        this_01 = *(function<void_(unsigned_long,_unsigned_long)> **)(local_38 + 8);
        local_38 = local_38 + 8;
        pfVar3 = this_01 + 0x10;
      }
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               &queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             &queueItem.super__Deque_base<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
  GlobalSearch<Protein>::~GlobalSearch((GlobalSearch<Protein> *)local_180);
  std::deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_>::~deque
            ((deque<Sequence<Protein>,_std::allocator<Sequence<Protein>_>_> *)&worker.mWriter);
  return;
}

Assistant:

void WorkerLoop( Args&&... args ) {
    QueueItem queueItem;
    Worker    worker( std::forward< Args >( args )... );

    while( true ) {
      { // acquire lock
        std::unique_lock< std::mutex > lock( mQueueMutex );

        while( !mStop && mQueue.empty() )
          mCondition.wait( lock );

        if( mStop )
          break;

        queueItem = std::move( mQueue.front() );
        mQueue.pop();

        mWorkingCount++;
      } // release lock

      worker.Process( queueItem );

      { // acquire lock
        std::unique_lock< std::mutex > lock( mQueueMutex );
        mTotalProcessed += QueueItemInfo< QueueItem >::Count( queueItem );
        mWorkingCount--;

        for( auto& cb : mProcessedCallbacks ) {
          cb( mTotalProcessed, mTotalEnqueued );
        }
      } // release lock
    }
  }